

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

void nn_sipc_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_sipc *sipc;
  nn_fsm_owner *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_28;
  
  local_28 = in_RDI;
  if (in_RDI == 0) {
    local_28 = 0;
  }
  if (in_ESI == 0xfffffffe && in_EDX == 0xfffffffd) {
    nn_pipebase_stop((nn_pipebase *)0x16a6e8);
    nn_streamhdr_stop((nn_streamhdr *)0x16a6f6);
    *(undefined4 *)(local_28 + 0x58) = 7;
  }
  if (*(int *)(local_28 + 0x58) == 7) {
    iVar1 = nn_streamhdr_isidle((nn_streamhdr *)0x16a729);
    if (iVar1 != 0) {
      nn_usock_swap_owner((nn_usock *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
      *(undefined8 *)(local_28 + 0x60) = 0;
      *(undefined4 *)(local_28 + 0x200) = 0xffffffff;
      *(undefined8 *)(local_28 + 0x208) = 0;
      *(undefined4 *)(local_28 + 0x58) = 1;
      nn_fsm_stopped((nn_fsm *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    }
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
          (ulong)*(uint *)(local_28 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/sipc.c"
          ,0xcb);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sipc_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_sipc *sipc;

    sipc = nn_cont (self, struct nn_sipc, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        nn_pipebase_stop (&sipc->pipebase);
        nn_streamhdr_stop (&sipc->streamhdr);
        sipc->state = NN_SIPC_STATE_STOPPING;
    }
    if (nn_slow (sipc->state == NN_SIPC_STATE_STOPPING)) {
        if (nn_streamhdr_isidle (&sipc->streamhdr)) {
            nn_usock_swap_owner (sipc->usock, &sipc->usock_owner);
            sipc->usock = NULL;
            sipc->usock_owner.src = -1;
            sipc->usock_owner.fsm = NULL;
            sipc->state = NN_SIPC_STATE_IDLE;
            nn_fsm_stopped (&sipc->fsm, NN_SIPC_STOPPED);
            return;
        }
        return;
    }

    nn_fsm_bad_state(sipc->state, src, type);
}